

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_manager.cpp
# Opt level: O1

void __thiscall duckdb::MetadataManager::Flush(MetadataManager *this)

{
  BlockManager *pBVar1;
  data_ptr_t pdVar2;
  shared_ptr<duckdb::BlockHandle,_true> *old_block;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  idx_t iVar5;
  idx_t iVar6;
  BlockHandle *pBVar7;
  FileBuffer *pFVar8;
  _Hash_node_base *p_Var9;
  BufferHandle handle;
  undefined1 local_88 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_70;
  ulong local_68;
  BufferHandle local_60;
  BufferHandle local_48;
  
  pBVar1 = this->block_manager;
  iVar5 = optional_idx::GetIndex(&pBVar1->block_alloc_size);
  iVar6 = optional_idx::GetIndex(&pBVar1->block_header_size);
  p_Var9 = (this->blocks)._M_h._M_before_begin._M_nxt;
  if (p_Var9 != (_Hash_node_base *)0x0) {
    local_68 = iVar5 - iVar6 & 0xfffffffffffffe00;
    do {
      (*this->buffer_manager->_vptr_BufferManager[7])
                (&local_60,this->buffer_manager,
                 (shared_ptr<duckdb::BlockHandle,_true> *)(p_Var9 + 2));
      optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_60.node);
      pdVar2 = (local_60.node.ptr)->buffer;
      pBVar1 = this->block_manager;
      iVar5 = optional_idx::GetIndex(&pBVar1->block_alloc_size);
      iVar6 = optional_idx::GetIndex(&pBVar1->block_header_size);
      switchD_01306cb1::default(pdVar2 + local_68,0,iVar5 - (iVar6 + local_68));
      pBVar7 = shared_ptr<duckdb::BlockHandle,_true>::operator->
                         ((shared_ptr<duckdb::BlockHandle,_true> *)(p_Var9 + 2));
      if (pBVar7->block_id < 0x4000000000000060) {
        pBVar1 = this->block_manager;
        pFVar8 = BufferHandle::GetFileBuffer(&local_60);
        (*pBVar1->_vptr_BlockManager[0xe])(pBVar1,pFVar8,p_Var9[4]._M_nxt);
      }
      else {
        pBVar1 = this->block_manager;
        old_block = (shared_ptr<duckdb::BlockHandle,_true> *)p_Var9[1]._M_nxt;
        local_88._0_8_ = p_Var9[2]._M_nxt;
        local_88._8_8_ = p_Var9[3]._M_nxt;
        p_Var9[3]._M_nxt = (_Hash_node_base *)0x0;
        p_Var9[2]._M_nxt = (_Hash_node_base *)0x0;
        BufferHandle::BufferHandle(&local_48,&local_60);
        BlockManager::ConvertToPersistent
                  ((BlockManager *)(local_88 + 0x10),(block_id_t)pBVar1,old_block,
                   (BufferHandle *)local_88);
        p_Var4 = p_Stack_70;
        uVar3 = local_88._16_8_;
        local_88._16_8_ = (FileBuffer *)0x0;
        p_Stack_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var9[3]._M_nxt;
        p_Var9[2]._M_nxt = (_Hash_node_base *)uVar3;
        p_Var9[3]._M_nxt = (_Hash_node_base *)p_Var4;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        if (p_Stack_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_70);
        }
        BufferHandle::~BufferHandle(&local_48);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
        }
      }
      BufferHandle::~BufferHandle(&local_60);
      p_Var9 = p_Var9->_M_nxt;
    } while (p_Var9 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void MetadataManager::Flush() {
	const idx_t total_metadata_size = GetMetadataBlockSize() * METADATA_BLOCK_COUNT;

	// write the blocks of the metadata manager to disk
	for (auto &kv : blocks) {
		auto &block = kv.second;
		auto handle = buffer_manager.Pin(block.block);
		// zero-initialize the few leftover bytes
		memset(handle.Ptr() + total_metadata_size, 0, block_manager.GetBlockSize() - total_metadata_size);
		D_ASSERT(kv.first == block.block_id);
		if (block.block->BlockId() >= MAXIMUM_BLOCK) {
			// temporary block - convert to persistent
			block.block = block_manager.ConvertToPersistent(kv.first, std::move(block.block), std::move(handle));
		} else {
			// already a persistent block - only need to write it
			D_ASSERT(block.block->BlockId() == block.block_id);
			block_manager.Write(handle.GetFileBuffer(), block.block_id);
		}
	}
}